

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O3

ZeroCopyInputStream * __thiscall
google::protobuf::compiler::DiskSourceTree::OpenVirtualFile
          (DiskSourceTree *this,string *virtual_file,string *disk_file)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  char *__n;
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ZeroCopyInputStream *pZVar7;
  int *piVar8;
  LogMessage *pLVar9;
  pointer pMVar10;
  long lVar11;
  string *this_00;
  ulong uVar12;
  string temp_disk_file;
  LogFinisher local_c1;
  ZeroCopyInputStream *local_c0;
  DiskSourceTree *local_b8;
  string local_b0;
  string *local_90;
  string local_88;
  undefined1 local_68 [56];
  
  paVar1 = &local_88.field_2;
  pcVar2 = (virtual_file->_M_dataplus)._M_p;
  local_b8 = this;
  local_90 = disk_file;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar2,pcVar2 + virtual_file->_M_string_length);
  CanonicalizePath((string *)local_68,&local_88);
  uVar3 = local_68._0_8_;
  __n = (char *)virtual_file->_M_string_length;
  if ((__n == (char *)local_68._8_8_) &&
     ((__n == (char *)0x0 ||
      (iVar6 = bcmp((virtual_file->_M_dataplus)._M_p,(void *)local_68._0_8_,(size_t)__n), iVar6 == 0
      )))) {
    bVar4 = ContainsParentReference(virtual_file);
    if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if ((!bVar4) &&
       (pMVar10 = (local_b8->mappings_).
                  super__Vector_base<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
                  ._M_impl.super__Vector_impl_data._M_start,
       (local_b8->mappings_).
       super__Vector_base<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
       ._M_impl.super__Vector_impl_data._M_finish != pMVar10)) {
      lVar11 = 0x20;
      uVar12 = 0;
      do {
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        local_b0._M_string_length = 0;
        local_b0.field_2._M_local_buf[0] = '\0';
        this_00 = virtual_file;
        bVar5 = ApplyMapping(virtual_file,(string *)((long)pMVar10 + lVar11 + -0x20),
                             (string *)((long)&(pMVar10->virtual_path)._M_dataplus._M_p + lVar11),
                             &local_b0);
        bVar4 = true;
        if (bVar5) {
          pZVar7 = OpenDiskFile((DiskSourceTree *)this_00,&local_b0);
          if (pZVar7 == (ZeroCopyInputStream *)0x0) {
            piVar8 = __errno_location();
            if (*piVar8 == 0xd) {
              internal::LogMessage::LogMessage
                        ((LogMessage *)local_68,LOGLEVEL_WARNING,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/importer.cc"
                         ,0x1b1);
              pLVar9 = internal::LogMessage::operator<<
                                 ((LogMessage *)local_68,"Read access is denied for file: ");
              pLVar9 = internal::LogMessage::operator<<(pLVar9,&local_b0);
              internal::LogFinisher::operator=(&local_c1,pLVar9);
              internal::LogMessage::~LogMessage((LogMessage *)local_68);
              bVar4 = false;
              local_c0 = (ZeroCopyInputStream *)0x0;
            }
          }
          else {
            if (local_90 != (string *)0x0) {
              std::__cxx11::string::_M_assign((string *)local_90);
            }
            bVar4 = false;
            local_c0 = pZVar7;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,
                          CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                                   local_b0.field_2._M_local_buf[0]) + 1);
        }
        if (!bVar4) {
          return local_c0;
        }
        uVar12 = uVar12 + 1;
        pMVar10 = (local_b8->mappings_).
                  super__Vector_base<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar11 = lVar11 + 0x40;
      } while (uVar12 < (ulong)((long)(local_b8->mappings_).
                                      super__Vector_base<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar10 >>
                               6));
    }
  }
  else {
    if ((undefined1 *)uVar3 != local_68 + 0x10) {
      operator_delete((void *)uVar3,local_68._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  return (ZeroCopyInputStream *)0x0;
}

Assistant:

io::ZeroCopyInputStream* DiskSourceTree::OpenVirtualFile(
    const string& virtual_file,
    string* disk_file) {
  if (virtual_file != CanonicalizePath(virtual_file) ||
      ContainsParentReference(virtual_file)) {
    // We do not allow importing of paths containing things like ".." or
    // consecutive slashes since the compiler expects files to be uniquely
    // identified by file name.
    return NULL;
  }

  for (int i = 0; i < mappings_.size(); i++) {
    string temp_disk_file;
    if (ApplyMapping(virtual_file, mappings_[i].virtual_path,
                     mappings_[i].disk_path, &temp_disk_file)) {
      io::ZeroCopyInputStream* stream = OpenDiskFile(temp_disk_file);
      if (stream != NULL) {
        if (disk_file != NULL) {
          *disk_file = temp_disk_file;
        }
        return stream;
      }

      if (errno == EACCES) {
        // The file exists but is not readable.
        // TODO(kenton):  Find a way to report this more nicely.
        GOOGLE_LOG(WARNING) << "Read access is denied for file: " << temp_disk_file;
        return NULL;
      }
    }
  }

  return NULL;
}